

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_input.hpp
# Opt level: O2

void __thiscall tao::pegtl::internal::mmap_holder::~mmap_holder(mmap_holder *this)

{
  file_mapper::~file_mapper(&this->data);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~mmap_holder() = default;